

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void skiwi::compile_cinput_parameters(cinput_data *cinput,environment_map *env,asmcode *code)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  element_type *peVar4;
  operand local_2e4 [2];
  operation local_2dc [2];
  operand local_2d4 [2];
  operation local_2cc [2];
  operand local_2c4 [2];
  operation local_2bc;
  operand local_2b8 [3];
  operation local_2ac;
  int local_2a8 [5];
  operand local_294;
  int addr_1;
  operand local_28c;
  operation local_288;
  operand local_284 [3];
  operation local_278;
  operand local_274 [3];
  operation local_268;
  operand local_264 [3];
  operation local_258;
  operand local_254 [3];
  operation local_248;
  operand local_244 [3];
  operation local_238;
  operand local_234 [3];
  operation local_228;
  operand local_224 [3];
  operation local_218;
  operand local_214 [2];
  operation local_20c;
  operand local_208 [2];
  operation local_200 [2];
  operand local_1f8 [2];
  operation local_1f0;
  operand local_1ec [2];
  operation local_1e4;
  uint64_t local_1e0;
  uint64_t header;
  string local_1d0;
  undefined1 local_1b0 [8];
  environment_entry e_1;
  string name_1;
  operation local_168 [2];
  operand local_160 [2];
  operation local_158;
  int local_154 [5];
  operand local_140;
  int addr;
  operation local_138 [2];
  operand local_130 [2];
  operation local_128;
  operand local_124 [2];
  operation local_11c [2];
  operand local_114 [2];
  operation local_10c;
  operand local_108 [2];
  operation local_100 [2];
  operand local_f8 [2];
  operation local_f0;
  operand local_ec [2];
  operation local_e4 [2];
  operand local_dc [2];
  operation local_d4;
  operand local_d0 [2];
  operation local_c8 [2];
  operand local_c0 [2];
  operation local_b8 [2];
  operand local_b0 [2];
  operation local_a8;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_70 [8];
  environment_entry e;
  string name;
  int j;
  int rsp_index;
  int double_index;
  int int_index;
  asmcode *code_local;
  environment_map *env_local;
  cinput_data *cinput_local;
  
  rsp_index = 0;
  j = 0;
  name.field_2._12_4_ = 1;
  for (name.field_2._8_4_ = 0;
      sVar2 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
              ::size(&cinput->parameters), (int)name.field_2._8_4_ < (int)sVar2;
      name.field_2._8_4_ = name.field_2._8_4_ + 1) {
    pvVar3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
             ::operator[](&cinput->parameters,(long)(int)name.field_2._8_4_);
    if (pvVar3->second == cin_int) {
      pvVar3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
               ::operator[](&cinput->parameters,(long)(int)name.field_2._8_4_);
      std::__cxx11::string::string((string *)&e.live_range.last,(string *)pvVar3);
      environment_entry::environment_entry((environment_entry *)local_70);
      peVar4 = std::
               __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)env);
      bVar1 = environment<skiwi::environment_entry>::find
                        (peVar4,(environment_entry *)local_70,(string *)&e.live_range.last);
      if ((!bVar1) || (local_70._0_4_ != st_global)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
        throw_error(invalid_c_input_syntax,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
      }
      local_a8 = MOV;
      local_b0[1] = 9;
      local_b0[0] = MEM_R10;
      local_b8[1] = 0xa8;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                (code,&local_a8,local_b0 + 1,local_b0,(int *)(local_b8 + 1));
      if (rsp_index == 0) {
        local_b8[0] = SHL;
        local_c0[1] = 0xd;
        local_c0[0] = NUMBER;
        local_c8[1] = 1;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_b8,local_c0 + 1,local_c0,(int *)(local_c8 + 1));
        local_c8[0] = MOV;
        local_d0[1] = 0x19;
        local_d0[0] = RSI;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,local_c8,local_d0 + 1,(unsigned_long *)&e,local_d0);
      }
      else if (rsp_index == 1) {
        local_d4 = SHL;
        local_dc[1] = 0xc;
        local_dc[0] = NUMBER;
        local_e4[1] = 1;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,&local_d4,local_dc + 1,local_dc,(int *)(local_e4 + 1));
        local_e4[0] = MOV;
        local_ec[1] = 0x19;
        local_ec[0] = RDX;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,local_e4,local_ec + 1,(unsigned_long *)&e,local_ec);
      }
      else if (rsp_index == 2) {
        local_f0 = SHL;
        local_f8[1] = 0xb;
        local_f8[0] = NUMBER;
        local_100[1] = 1;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,&local_f0,local_f8 + 1,local_f8,(int *)(local_100 + 1));
        local_100[0] = MOV;
        local_108[1] = 0x19;
        local_108[0] = RCX;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,local_100,local_108 + 1,(unsigned_long *)&e,local_108);
      }
      else if (rsp_index == 3) {
        local_10c = SHL;
        local_114[1] = 0x11;
        local_114[0] = NUMBER;
        local_11c[1] = 1;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,&local_10c,local_114 + 1,local_114,(int *)(local_11c + 1));
        local_11c[0] = MOV;
        local_124[1] = 0x19;
        local_124[0] = R8;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,local_11c,local_124 + 1,(unsigned_long *)&e,local_124);
      }
      else if (rsp_index == 4) {
        local_128 = SHL;
        local_130[1] = 0x12;
        local_130[0] = NUMBER;
        local_138[1] = 1;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,&local_128,local_130 + 1,local_130,(int *)(local_138 + 1));
        local_138[0] = MOV;
        addr = 0x19;
        local_140 = R9;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,local_138,(operand *)&addr,(unsigned_long *)&e,&local_140);
      }
      else {
        local_154[4] = name.field_2._12_4_;
        local_154[3] = 0x40;
        local_154[2] = 0xb;
        local_154[1] = 0x1f;
        local_154[0] = name.field_2._12_4_ << 3;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,(operation *)(local_154 + 3),(operand *)(local_154 + 2),
                   (operand *)(local_154 + 1),local_154);
        local_158 = SHL;
        local_160[1] = 0xb;
        local_160[0] = NUMBER;
        local_168[1] = 1;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,&local_158,local_160 + 1,local_160,(int *)(local_168 + 1));
        local_168[0] = MOV;
        name_1.field_2._12_4_ = 0x19;
        name_1.field_2._8_4_ = 0xb;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,local_168,(operand *)(name_1.field_2._M_local_buf + 0xc),(unsigned_long *)&e
                   ,(operand *)(name_1.field_2._M_local_buf + 8));
        name.field_2._12_4_ = name.field_2._12_4_ + 1;
      }
      rsp_index = rsp_index + 1;
      std::__cxx11::string::~string((string *)&e.live_range.last);
    }
    else {
      pvVar3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
               ::operator[](&cinput->parameters,(long)(int)name.field_2._8_4_);
      if (pvVar3->second == cin_double) {
        pvVar3 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
                 ::operator[](&cinput->parameters,(long)(int)name.field_2._8_4_);
        std::__cxx11::string::string((string *)&e_1.live_range.last,(string *)pvVar3);
        environment_entry::environment_entry((environment_entry *)local_1b0);
        peVar4 = std::
                 __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)env);
        bVar1 = environment<skiwi::environment_entry>::find
                          (peVar4,(environment_entry *)local_1b0,(string *)&e_1.live_range.last);
        if ((!bVar1) || (local_1b0._0_4_ != st_global)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,"",(allocator<char> *)((long)&header + 7));
          throw_error(invalid_c_input_syntax,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&header + 7));
        }
        local_1e0 = make_block_header(1,T_FLONUM);
        local_1e4 = MOV;
        local_1ec[1] = 0x18;
        local_1ec[0] = RBP;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
                  (code,&local_1e4,local_1ec + 1,local_1ec);
        local_1f0 = OR;
        local_1f8[1] = 0x18;
        local_1f8[0] = NUMBER;
        local_200[1] = 5;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,&local_1f0,local_1f8 + 1,local_1f8,(int *)(local_200 + 1));
        local_200[0] = MOV;
        local_208[1] = 9;
        local_208[0] = NUMBER;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
                  (code,local_200,local_208 + 1,local_208,&local_1e0);
        local_20c = MOV;
        local_214[1] = 0x20;
        local_214[0] = RAX;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
                  (code,&local_20c,local_214 + 1,local_214);
        if (j == 0) {
          local_218 = MOVQ;
          local_224[2] = 0x20;
          local_224[1] = 8;
          local_224[0] = XMM0;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,&local_218,local_224 + 2,(int *)(local_224 + 1),local_224);
        }
        else if (j == 1) {
          local_228 = MOVQ;
          local_234[2] = 0x20;
          local_234[1] = 8;
          local_234[0] = XMM1;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,&local_228,local_234 + 2,(int *)(local_234 + 1),local_234);
        }
        else if (j == 2) {
          local_238 = MOVQ;
          local_244[2] = 0x20;
          local_244[1] = 8;
          local_244[0] = XMM2;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,&local_238,local_244 + 2,(int *)(local_244 + 1),local_244);
        }
        else if (j == 3) {
          local_248 = MOVQ;
          local_254[2] = 0x20;
          local_254[1] = 8;
          local_254[0] = XMM3;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,&local_248,local_254 + 2,(int *)(local_254 + 1),local_254);
        }
        else if (j == 4) {
          local_258 = MOVQ;
          local_264[2] = 0x20;
          local_264[1] = 8;
          local_264[0] = XMM4;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,&local_258,local_264 + 2,(int *)(local_264 + 1),local_264);
        }
        else if (j == 5) {
          local_268 = MOVQ;
          local_274[2] = 0x20;
          local_274[1] = 8;
          local_274[0] = XMM5;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,&local_268,local_274 + 2,(int *)(local_274 + 1),local_274);
        }
        else if (j == 6) {
          local_278 = MOVQ;
          local_284[2] = 0x20;
          local_284[1] = 8;
          local_284[0] = XMM6;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,&local_278,local_284 + 2,(int *)(local_284 + 1),local_284);
        }
        else if (j == 7) {
          local_288 = MOVQ;
          local_28c = MEM_RBP;
          addr_1 = 8;
          local_294 = XMM7;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,&local_288,&local_28c,&addr_1,&local_294);
        }
        else {
          local_2a8[4] = name.field_2._12_4_;
          local_2a8[3] = 0x40;
          local_2a8[2] = 9;
          local_2a8[1] = 0x1f;
          local_2a8[0] = name.field_2._12_4_ << 3;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                    (code,(operation *)(local_2a8 + 3),(operand *)(local_2a8 + 2),
                     (operand *)(local_2a8 + 1),local_2a8);
          local_2ac = MOV;
          local_2b8[2] = 0x20;
          local_2b8[1] = 8;
          local_2b8[0] = RAX;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,&local_2ac,local_2b8 + 2,(int *)(local_2b8 + 1),local_2b8);
          name.field_2._12_4_ = name.field_2._12_4_ + 1;
        }
        local_2bc = ADD;
        local_2c4[1] = 0x10;
        local_2c4[0] = NUMBER;
        local_2cc[1] = 0x10;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,&local_2bc,local_2c4 + 1,local_2c4,(int *)(local_2cc + 1));
        local_2cc[0] = MOV;
        local_2d4[1] = 9;
        local_2d4[0] = MEM_R10;
        local_2dc[1] = 0xa8;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_2cc,local_2d4 + 1,local_2d4,(int *)(local_2dc + 1));
        local_2dc[0] = MOV;
        local_2e4[1] = 0x19;
        local_2e4[0] = R15;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,local_2dc,local_2e4 + 1,(unsigned_long *)&e_1,local_2e4);
        j = j + 1;
        std::__cxx11::string::~string((string *)&e_1.live_range.last);
      }
    }
  }
  return;
}

Assistant:

void compile_cinput_parameters(cinput_data& cinput, environment_map& env, asmcode& code)
  {
#ifdef _WIN32
  for (int j = 0; j < (int)cinput.parameters.size(); ++j)
    {
    if (cinput.parameters[j].second == cinput_data::cin_int)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      if (j == 0)
        {
        code.add(asmcode::SHL, asmcode::RDX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RDX);
        }
      else if (j == 1)
        {
        code.add(asmcode::SHL, asmcode::R8, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R8);
        }
      else if (j == 2)
        {
        code.add(asmcode::SHL, asmcode::R9, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R9);
        }
      else
        {
        int addr = j - 3;
        code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RSP, (40 + addr * 8));
        code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RCX);
        }
      }
    else if (cinput.parameters[j].second == cinput_data::cin_double)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);

      uint64_t header = make_block_header(1, T_FLONUM);
      code.add(asmcode::MOV, asmcode::R15, ALLOC);
      code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
      code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
      code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);

      if (j == 0)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM1);
      else if (j == 1)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM2);
      else if (j == 2)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM3);
      else
        {
        int addr = j - 3;
        code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RSP, (40 + addr * 8));
        code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RAX);
        }

      code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R15);
      }
    }
#else
  int int_index = 0;
  int double_index = 0;
  int rsp_index = 1;
  for (int j = 0; j < (int)cinput.parameters.size(); ++j)
    {
    if (cinput.parameters[j].second == cinput_data::cin_int)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      if (int_index == 0)
        {
        code.add(asmcode::SHL, asmcode::RSI, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RSI);
        }
      else if (int_index == 1)
        {
        code.add(asmcode::SHL, asmcode::RDX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RDX);
        }
      else if (int_index == 2)
        {
        code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RCX);
        }
      else if (int_index == 3)
        {
        code.add(asmcode::SHL, asmcode::R8, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R8);
        }
      else if (int_index == 4)
        {
        code.add(asmcode::SHL, asmcode::R9, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R9);
        }
      else
        {
        int addr = rsp_index;
        code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RSP, 8 * addr);
        code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RCX);
        ++rsp_index;
        }
      ++int_index;
      }
    else if (cinput.parameters[j].second == cinput_data::cin_double)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);

      uint64_t header = make_block_header(1, T_FLONUM);
      code.add(asmcode::MOV, asmcode::R15, ALLOC);
      code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
      code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
      code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);

      if (double_index == 0)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM0);
      else if (double_index == 1)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM1);
      else if (double_index == 2)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM2);
      else if (double_index == 3)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM3);
      else if (double_index == 4)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM4);
      else if (double_index == 5)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM5);
      else if (double_index == 6)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM6);
      else if (double_index == 7)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM7);
      else
        {
        int addr = rsp_index;
        code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RSP, 8 * addr);
        code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RAX);
        ++rsp_index;
        }

      code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R15);
      ++double_index;
      }
    }
#endif
  }